

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_poll_init(void)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  epoll_event chevent;
  
  fio_poll_close();
  lVar3 = 0;
  while (lVar3 != 0xc) {
    iVar1 = epoll_create1(0x80000);
    *(int *)((long)evio_fd + lVar3) = iVar1;
    lVar3 = lVar3 + 4;
    if (iVar1 == -1) goto LAB_00108b67;
  }
  lVar3 = 0;
  do {
    if (lVar3 == 2) {
      return;
    }
    chevent.events = 5;
    chevent.data.fd = evio_fd[lVar3 + 1];
    iVar1 = epoll_ctl(evio_fd[0],1,chevent.data.fd,(epoll_event *)&chevent);
    lVar3 = lVar3 + 1;
  } while (iVar1 != -1);
LAB_00108b67:
  if (0 < FIO_LOG_LEVEL) {
    FIO_LOG2STDERR("FATAL: couldn\'t initialize epoll.");
  }
  fio_poll_close();
  piVar2 = __errno_location();
  exit(*piVar2);
}

Assistant:

static void fio_poll_init(void) {
  fio_poll_close();
  for (int i = 0; i < 3; ++i) {
    evio_fd[i] = epoll_create1(EPOLL_CLOEXEC);
    if (evio_fd[i] == -1)
      goto error;
  }
  for (int i = 1; i < 3; ++i) {
    struct epoll_event chevent = {
        .events = (EPOLLOUT | EPOLLIN),
        .data.fd = evio_fd[i],
    };
    if (epoll_ctl(evio_fd[0], EPOLL_CTL_ADD, evio_fd[i], &chevent) == -1)
      goto error;
  }
  return;
error:
  FIO_LOG_FATAL("couldn't initialize epoll.");
  fio_poll_close();
  exit(errno);
  return;
}